

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::TexImage2D::TexImage2D
          (TexImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint internalFormat,GLsizei width,GLsizei height,GLenum format,GLenum type,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_48;
  
  Operation::Operation(&this->super_Operation,"TexImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__TexImage2D_003d5e70;
  local_50 = texture;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  this->m_level = level;
  this->m_internalFormat = internalFormat;
  this->m_width = width;
  this->m_height = height;
  this->m_format = format;
  this->m_type = type;
  local_60.m_ptr = &((this->m_texture).m_ptr)->super_Object;
  local_60.m_state = (this->m_texture).m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_60.m_state)->strongRefCount = (local_60.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_60.m_state)->weakRefCount = (local_60.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_60);
  ((this->m_texture).m_ptr)->isDefined = true;
  local_48.m_ptr = (EGLImage *)0x0;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=
            (&local_50->m_ptr->sourceImage,&local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::release(&local_48);
  return;
}

Assistant:

TexImage2D::TexImage2D (SharedPtr<Texture> texture, GLint level, GLint internalFormat, GLsizei width, GLsizei height, GLenum format, GLenum type, bool useSync, bool serverSync)
	: Operation			("TexImage2D", useSync, serverSync)
	, m_texture			(texture)
	, m_level			(level)
	, m_internalFormat	(internalFormat)
	, m_width			(width)
	, m_height			(height)
	, m_format			(format)
	, m_type			(type)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
	m_texture->isDefined = true;

	// Orphang texture
	texture->sourceImage = SharedPtr<EGLImage>();
}